

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::DateTimePickerPrivate::setValue
          (DateTimePickerPrivate *this,QDateTime *dt,bool updateIndexes)

{
  QDateTime *lhs;
  QVector<Section> *this_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  reference pSVar5;
  int i;
  long i_00;
  QDateTime *pQVar6;
  long lVar7;
  
  lhs = &this->value;
  bVar1 = operator!=(lhs,dt);
  if (!bVar1) {
    return;
  }
  bVar1 = operator>=(dt,&this->minimum);
  if (((!bVar1) || (bVar1 = operator<=(dt,&this->maximum), pQVar6 = dt, !bVar1)) &&
     (cVar2 = QDateTime::precedes(dt), pQVar6 = &this->minimum, cVar2 == '\0')) {
    pQVar6 = &this->maximum;
    cVar2 = QDateTime::precedes(pQVar6);
    if (cVar2 == '\0') goto LAB_00168968;
  }
  QDateTime::operator=(lhs,pQVar6);
LAB_00168968:
  fillValues(this,updateIndexes);
  if ((updateIndexes) || (bVar1 = operator!=(lhs,dt), bVar1)) {
    this_00 = &(this->super_DateTimeParser).sections;
    lVar7 = 0;
    for (i_00 = 0; i_00 < (this->super_DateTimeParser).sections.d.size; i_00 = i_00 + 1) {
      iVar3 = *(int *)((long)&((this->super_DateTimeParser).sections.d.ptr)->type + lVar7);
      switch(iVar3) {
      case 1:
        QDateTime::time();
        iVar3 = QTime::hour();
        if (iVar3 != 0) {
          QDateTime::time();
          iVar3 = QTime::hour();
          if (iVar3 < 0xd) {
            pSVar5 = QList<QtMWidgets::Section>::operator[](this_00,i_00);
            pSVar5->currentIndex = 0;
            break;
          }
        }
        pSVar5 = QList<QtMWidgets::Section>::operator[](this_00,i_00);
        pSVar5->currentIndex = 1;
        break;
      case 2:
        QDateTime::time();
        iVar3 = QTime::second();
        goto LAB_00168b66;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        QDateTime::time();
        iVar3 = QTime::minute();
        goto LAB_00168b66;
      case 8:
        QDateTime::time();
        iVar3 = QTime::hour();
        if (iVar3 != 0) {
          QDateTime::time();
          iVar3 = QTime::hour();
          if (iVar3 < 0xd) {
            QDateTime::time();
            iVar3 = QTime::hour();
            goto LAB_00168ad0;
          }
          QDateTime::time();
          iVar3 = QTime::hour();
          iVar3 = iVar3 + -0xd;
          goto LAB_00168b66;
        }
        pSVar5 = QList<QtMWidgets::Section>::operator[](this_00,i_00);
        pSVar5->currentIndex = 0xb;
        break;
      default:
        if (iVar3 == 0x10) {
          QDateTime::time();
          iVar3 = QTime::hour();
        }
        else {
          if (((iVar3 == 0x20) || (iVar3 == 0x40)) || (iVar3 == 0x80)) {
            QDateTime::date();
            iVar3 = QDate::day();
          }
          else {
            if (((iVar3 != 0x100) && (iVar3 != 0x200)) && (iVar3 != 0x400)) {
              if ((iVar3 != 0x800) && (iVar3 != 0x1000)) break;
              QDateTime::date();
              iVar3 = QDate::year();
              QDateTime::date();
              iVar4 = QDate::year();
              iVar3 = iVar3 - iVar4;
              goto LAB_00168b66;
            }
            QDateTime::date();
            iVar3 = QDate::month();
          }
LAB_00168ad0:
          iVar3 = iVar3 + -1;
        }
LAB_00168b66:
        pSVar5 = QList<QtMWidgets::Section>::operator[](this_00,i_00);
        pSVar5->currentIndex = iVar3;
      }
      lVar7 = lVar7 + 0x30;
    }
  }
  emitSignals(this);
  return;
}

Assistant:

void
DateTimePickerPrivate::setValue( const QDateTime & dt, bool updateIndexes )
{
	if( value != dt )
	{
		if( dt >= minimum && dt <= maximum )
			value = dt;
		else if( dt < minimum )
			value = minimum;
		else if( dt > maximum )
			value = maximum;

		fillValues( updateIndexes );

		if( updateIndexes || value != dt )
		{
			for( int i = 0; i < sections.size(); ++i )
			{
				switch( sections.at( i ).type )
				{
					case Section::AmPmSection :
					{
						if( value.time().hour() == 0 ||
							value.time().hour() > 12 )
								sections[ i ].currentIndex = 1;
						else
							sections[ i ].currentIndex = 0;
					}
					break;

					case Section::SecondSection :
					{
						sections[ i ].currentIndex = value.time().second();
					}
					break;

					case Section::MinuteSection :
					{
						sections[ i ].currentIndex = value.time().minute();
					}
					break;

					case Section::Hour12Section :
					{
						if( value.time().hour() == 0 )
							sections[ i ].currentIndex = 11;
						else if( value.time().hour() > 12 )
							sections[ i ].currentIndex = value.time().hour() - 12 - 1;
						else
							sections[ i ].currentIndex = value.time().hour() - 1;
					}
					break;

					case Section::Hour24Section :
					{
						sections[ i ].currentIndex = value.time().hour();
					}
					break;

					case Section::DaySection :
					case Section::DaySectionShort :
					case Section::DaySectionLong :
					{
						sections[ i ].currentIndex = value.date().day() - 1;
					}
					break;

					case Section::MonthSection :
					case Section::MonthSectionShort :
					case Section::MonthSectionLong :
					{
						sections[ i ].currentIndex = value.date().month() - 1;
					}
					break;

					case Section::YearSection :
					case Section::YearSection2Digits :
					{
						sections[ i ].currentIndex = value.date().year() -
							minimum.date().year();
					}
					break;

					default:
						break;
				}
			}
		}

		emitSignals();
	}
}